

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

void __thiscall
Fl_Text_Buffer::redisplay_selection
          (Fl_Text_Buffer *this,Fl_Text_Selection *oldSelection,Fl_Text_Selection *newSelection)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  iVar1 = oldSelection->mStart;
  iVar2 = oldSelection->mEnd;
  iVar8 = newSelection->mStart;
  iVar3 = newSelection->mEnd;
  if (oldSelection->mSelected == false) {
    if ((newSelection->mSelected == true) && (0 < this->mNModifyProcs)) {
      lVar7 = 0;
      do {
        (*this->mModifyProcs[lVar7])(iVar8,0,0,iVar3 - iVar8,(char *)0x0,this->mCbArgs[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->mNModifyProcs);
    }
  }
  else if (newSelection->mSelected == false) {
    if (0 < this->mNModifyProcs) {
      lVar7 = 0;
      do {
        (*this->mModifyProcs[lVar7])(iVar1,0,0,iVar2 - iVar1,(char *)0x0,this->mCbArgs[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->mNModifyProcs);
    }
  }
  else if (iVar3 < iVar1 || iVar2 < iVar8) {
    if (0 < this->mNModifyProcs) {
      lVar7 = 0;
      do {
        (*this->mModifyProcs[lVar7])(iVar1,0,0,iVar2 - iVar1,(char *)0x0,this->mCbArgs[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->mNModifyProcs);
    }
    if (0 < this->mNModifyProcs) {
      lVar7 = 0;
      do {
        (*this->mModifyProcs[lVar7])(iVar8,0,0,iVar3 - iVar8,(char *)0x0,this->mCbArgs[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->mNModifyProcs);
    }
  }
  else {
    iVar5 = iVar3;
    if (iVar3 < iVar2) {
      iVar5 = iVar2;
    }
    iVar6 = iVar3;
    if (iVar2 < iVar3) {
      iVar6 = iVar2;
    }
    iVar4 = iVar8;
    if (iVar1 < iVar8) {
      iVar4 = iVar1;
    }
    if (iVar1 != iVar8) {
      if (iVar8 < iVar1) {
        iVar8 = iVar1;
      }
      if (0 < this->mNModifyProcs) {
        lVar7 = 0;
        do {
          (*this->mModifyProcs[lVar7])(iVar4,0,0,iVar8 - iVar4,(char *)0x0,this->mCbArgs[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->mNModifyProcs);
      }
    }
    if ((iVar2 != iVar3) && (0 < this->mNModifyProcs)) {
      lVar7 = 0;
      do {
        (*this->mModifyProcs[lVar7])(iVar6,0,0,iVar5 - iVar6,(char *)0x0,this->mCbArgs[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->mNModifyProcs);
    }
  }
  return;
}

Assistant:

void Fl_Text_Buffer::redisplay_selection(Fl_Text_Selection *
					   oldSelection,
					   Fl_Text_Selection *
					   newSelection) const
{
  int oldStart, oldEnd, newStart, newEnd, ch1Start, ch1End, ch2Start,
  ch2End;
  
  /* If either selection is rectangular, add an additional character to
   the end of the selection to request the redraw routines to wipe out
   the parts of the selection beyond the end of the line */
  oldStart = oldSelection->mStart;
  newStart = newSelection->mStart;
  oldEnd = oldSelection->mEnd;
  newEnd = newSelection->mEnd;
  
  /* If the old or new selection is unselected, just redisplay the
   single area that is (was) selected and return */
  if (!oldSelection->mSelected && !newSelection->mSelected)
    return;
  if (!oldSelection->mSelected)
  {
    call_modify_callbacks(newStart, 0, 0, newEnd - newStart, NULL);
    return;
  }
  if (!newSelection->mSelected) {
    call_modify_callbacks(oldStart, 0, 0, oldEnd - oldStart, NULL);
    return;
  }
  
  /* If the selections are non-contiguous, do two separate updates
   and return */
  if (oldEnd < newStart || newEnd < oldStart) {
    call_modify_callbacks(oldStart, 0, 0, oldEnd - oldStart, NULL);
    call_modify_callbacks(newStart, 0, 0, newEnd - newStart, NULL);
    return;
  }
  
  /* Otherwise, separate into 3 separate regions: ch1, and ch2 (the two
   changed areas), and the unchanged area of their intersection,
   and update only the changed area(s) */
  ch1Start = min(oldStart, newStart);
  ch2End = max(oldEnd, newEnd);
  ch1End = max(oldStart, newStart);
  ch2Start = min(oldEnd, newEnd);
  if (ch1Start != ch1End)
    call_modify_callbacks(ch1Start, 0, 0, ch1End - ch1Start, NULL);
  if (ch2Start != ch2End)
    call_modify_callbacks(ch2Start, 0, 0, ch2End - ch2Start, NULL);
}